

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_kaku.c
# Opt level: O2

int kaku_send(rf_dev_t *dev,uint8_t *data)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  bool bVar4;
  timespec ifg_time;
  uint8_t frame_buf [234];
  
  memset(frame_buf,0,0xea);
  frame_buf[0] = 0xff;
  puVar2 = encode_kaku(frame_buf + 9,*data);
  puVar2 = encode_kaku(puVar2,data[1]);
  puVar2 = encode_kaku(puVar2,data[2]);
  puVar2 = encode_kaku(puVar2,data[3]);
  *puVar2 = 0xff;
  iVar3 = 4;
  while ((bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, iVar1 = 0, bVar4 &&
         (iVar1 = rf_send(dev,frame_buf,0xea), iVar1 == 0))) {
    ifg_time.tv_sec = 0;
    ifg_time.tv_nsec = 7700000;
    nanosleep((timespec *)&ifg_time,(timespec *)0x0);
  }
  return iVar1;
}

Assistant:

int kaku_send(rf_dev_t *dev, uint8_t data[4])
{
	int ret;
	uint8_t frame_buf[KAKU_FRAME_IVALS];
  	uint8_t *frame_head = frame_buf;

	memset(frame_buf, 0, sizeof(frame_buf));

	// Preamble
	*frame_head = 0xff;
	frame_head += KAKU_PREAMBLE_IVALS;

	// Data
	frame_head = encode_kaku(frame_head, data[0]);
	frame_head = encode_kaku(frame_head, data[1]);
	frame_head = encode_kaku(frame_head, data[2]);
	frame_head = encode_kaku(frame_head, data[3]);

	// Stop bit
	*frame_head = 0xff;

	for (int i=0; i < KAKU_FRAME_REPEAT; i++) {
		ret = rf_send(dev, frame_buf, sizeof(frame_buf));
		if (ret != ERR_OK) {
			return ret;
		}

		// Inter Frame Gap
		struct timespec ifg_time = {
			0, KAKU_INTER_FRAME_GAP_US * 1000
		};
		nanosleep(&ifg_time, NULL);
	}

	return ERR_OK;
}